

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

shared_ptr<helics::helicsCLI11App> __thiscall helics::CoreBroker::generateCLI(CoreBroker *this)

{
  App *pAVar1;
  Option *opt;
  Option *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<helics::helicsCLI11App> sVar2;
  allocator<char> local_102;
  allocator<char> local_101;
  function<void_()> local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  std::make_shared<helics::helicsCLI11App,char_const(&)[18]>((char (*) [18])this);
  helicsCLI11App::remove_helics_specifics((helicsCLI11App *)(this->super_Broker)._vptr_Broker);
  pAVar1 = (App *)(this->super_Broker)._vptr_Broker;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"--root",&local_101);
  local_100.super__Function_base._M_functor._8_8_ = 0;
  local_100._M_invoker =
       CLI::std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2386:19)>
       ::_M_invoke;
  local_100.super__Function_base._M_manager =
       CLI::std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/CoreBroker.cpp:2386:19)>
       ::_M_manager;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"specify whether the broker is a root",&local_102);
  CLI::App::add_flag_callback(pAVar1,&local_40,&local_100,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::_Function_base::~_Function_base((_Function_base *)&local_100);
  std::__cxx11::string::~string((string *)&local_40);
  pAVar1 = (App *)(this->super_Broker)._vptr_Broker;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"--timemonitor",&local_101)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,
             "specify a federate to use as the primary time monitor for logging and indicator purpose, it has no actual impact on the cosimulation"
             ,&local_102);
  opt = CLI::App::
        add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                  (pAVar1,&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (in_RSI + 0xd98),&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  pAVar1 = (App *)(this->super_Broker)._vptr_Broker;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"--timemonitorperiod",&local_101);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"period to display logs of times from the time monitor federate",
             &local_102);
  this_00 = CLI::App::
            add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
                      (pAVar1,&local_c0,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0xdc0)
                       ,&local_e0);
  CLI::Option::needs(this_00,opt);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar2.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> CoreBroker::generateCLI()
{
    auto app = std::make_shared<helicsCLI11App>("Option for Broker");
    app->remove_helics_specifics();
    app->add_flag_callback(
        "--root", [this]() { setAsRoot(); }, "specify whether the broker is a root");
    auto* tfed = app->add_option(
        "--timemonitor",
        mTimeMonitorFederate,
        "specify a federate to use as the primary time monitor for logging and indicator purpose, it has no actual impact on the cosimulation");
    app->add_option("--timemonitorperiod",
                    mTimeMonitorPeriod,
                    "period to display logs of times from the time monitor federate")
        ->needs(tfed);
    return app;
}